

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray_p.cpp
# Opt level: O1

ByteArray * __thiscall BamTools::Internal::ByteArray::Remove(ByteArray *this,size_t from,size_t n)

{
  ulong uVar1;
  pointer pcVar2;
  value_type *__x;
  ulong uVar3;
  value_type local_1a [2];
  
  pcVar2 = (this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  if (from < uVar3) {
    uVar1 = n + from;
    if (uVar3 < uVar1 || uVar3 - uVar1 == 0) {
      __x = local_1a;
      local_1a[0] = '\0';
    }
    else {
      memmove(pcVar2 + from,pcVar2 + uVar1,uVar3 - uVar1);
      from = uVar3 - n;
      __x = local_1a + 1;
      local_1a[1] = 0;
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->m_data,from,__x);
  }
  return this;
}

Assistant:

ByteArray& ByteArray::Remove(std::size_t from, std::size_t n)
{

    // if 'from' outside range, just return
    const std::size_t originalSize = m_data.size();
    if (from >= originalSize) {
        return *this;
    }

    // if asked to clip from 'from' to end (or beyond), simply resize
    if (from + n >= originalSize) {
        Resize(from);

        // otherwise, shift data & resize
    } else {
        std::memmove(&m_data[from], &m_data[from + n], (originalSize - from - n));
        Resize(originalSize - n);
    }

    // return reference to modified byte array
    return *this;
}